

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O0

void LEARNER::process_example(vw *all,example *ec)

{
  bool bVar1;
  size_t sVar2;
  example *in_RSI;
  example *in_stack_000000a8;
  vw *in_stack_000000b0;
  example *in_stack_ffffffffffffffe8;
  
  sVar2 = v_array<unsigned_char>::size((v_array<unsigned_char> *)in_RSI);
  if (sVar2 < 2) {
    if ((in_RSI->end_pass & 1U) == 0) {
      bVar1 = is_save_cmd(in_RSI);
      if (bVar1) {
        save(in_stack_000000b0,in_stack_000000a8);
      }
      else {
        dispatch_example((vw *)in_RSI,in_stack_ffffffffffffffe8);
      }
    }
    else {
      dispatch_end_pass((vw *)in_RSI,in_stack_ffffffffffffffe8);
    }
  }
  else {
    dispatch_example((vw *)in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void process_example(vw& all, example* ec)
{
  if (ec->indices.size() > 1)  // 1+ nonconstant feature. (most common case first)
    dispatch_example(all, *ec);
  else if (ec->end_pass)
    dispatch_end_pass(all, *ec);
  else if (is_save_cmd(ec))
    save(all, ec);
  else
    dispatch_example(all, *ec);
}